

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ProcessGetCFCheckPt
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  uint256 *puVar1;
  CConnman *this_00;
  string msg_type;
  bool bVar2;
  bool bVar3;
  CBlockIndex *this_01;
  Logger *this_02;
  string *args;
  uint uVar4;
  uint uVar5;
  DataStream *__nbytes;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined1 in_stack_fffffffffffffea8 [12];
  CBlockIndex *pCVar10;
  vector<uint256,_std::allocator<uint256>_> headers;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  BlockFilterType local_f9;
  uint256 local_f8;
  long *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  uint256 stop_hash;
  long *local_98;
  undefined8 uStack_90;
  long local_88;
  undefined8 uStack_80;
  undefined1 local_70 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  __nbytes = vRecv;
  DataStream::read(vRecv,(int)&local_f9,(void *)0x1,(size_t)vRecv);
  DataStream::read(vRecv,(int)&stop_hash,(void *)0x20,(size_t)__nbytes);
  uVar4 = (uint)local_f9;
  bVar2 = PrepareBlockFilterRequest
                    (this,node,peer,local_f9,0,&stop_hash,0xffffffff,&stop_index,&filter_index);
  if (bVar2) {
    this_01 = stop_index;
    std::vector<uint256,_std::allocator<uint256>_>::vector
              (&headers,(long)(stop_index->nHeight / 1000),(allocator_type *)local_70);
    iVar9 = (int)((ulong)((long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 5);
    uVar5 = iVar9 - 1;
    pCVar10 = this_01;
    if (-1 < (int)uVar5) {
      iVar9 = iVar9 * 1000;
      lVar6 = (ulong)uVar5 << 5;
      lVar7 = (ulong)uVar5 + 1;
      do {
        this_01 = CBlockIndex::GetAncestor(this_01,iVar9);
        bVar2 = BlockFilterIndex::LookupFilterHeader
                          (filter_index,this_01,
                           (uint256 *)
                           (((headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                              super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                            _M_elems + lVar6));
        if (!bVar2) {
          this_02 = LogInstance();
          bVar3 = BCLog::Logger::WillLogCategoryLevel(this_02,NET,Debug);
          if (bVar3) {
            args = BlockFilterTypeName_abi_cxx11_((BlockFilterType)uVar4);
            puVar1 = this_01->phashBlock;
            if (puVar1 == (uint256 *)0x0) goto LAB_00906507;
            local_98 = *(long **)(puVar1->super_base_blob<256U>).m_data._M_elems;
            uStack_90 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
            local_88 = *(long *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
            uStack_80 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
            base_blob<256u>::ToString_abi_cxx11_((string *)local_70,&local_98);
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file._M_len = 0x62;
            logging_function._M_str = "ProcessGetCFCheckPt";
            logging_function._M_len = 0x13;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function,source_file,0xe0a,NET,Debug,
                       (ConstevalFormatString<2U>)0xf9f37d,args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
            if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
              operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
            }
          }
          if (!bVar2) goto LAB_009064c7;
        }
        iVar9 = iVar9 + -1000;
        lVar6 = lVar6 + -0x20;
        lVar8 = lVar7 + -1;
        bVar2 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar2);
    }
    local_d8 = (long *)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"cfcheckpt","");
    puVar1 = pCVar10->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_00906507:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_f8.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_f8.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_f8.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_f8.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    this_00 = this->m_connman;
    if (local_d8 == (long *)&local_c8) {
      uStack_80 = uStack_c0;
      local_98 = &local_88;
    }
    else {
      local_98 = local_d8;
    }
    local_88 = CONCAT71(uStack_c7,local_c8);
    uStack_90 = local_d0;
    local_d0 = 0;
    local_c8 = 0;
    msg_type._M_string_length._4_4_ = uVar4;
    msg_type._0_12_ = in_stack_fffffffffffffea8;
    msg_type.field_2._M_allocated_capacity = (size_type)pCVar10;
    msg_type.field_2._8_8_ = node;
    local_d8 = (long *)&local_c8;
    NetMsg::Make<unsigned_char&,uint256,std::vector<uint256,std::allocator<uint256>>&>
              ((CSerializedNetMsg *)local_70,(NetMsg *)&local_98,msg_type,&local_f9,&local_f8,
               &headers);
    CConnman::PushMessage(this_00,node,(CSerializedNetMsg *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._24_8_ != &local_48) {
      operator_delete((void *)local_70._24_8_,local_48._M_allocated_capacity + 1);
    }
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_d8 != (long *)&local_c8) {
      operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    }
LAB_009064c7:
    if (headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFCheckPt(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, /*start_height=*/0, stop_hash,
                                   /*max_height_diff=*/std::numeric_limits<uint32_t>::max(),
                                   stop_index, filter_index)) {
        return;
    }

    std::vector<uint256> headers(stop_index->nHeight / CFCHECKPT_INTERVAL);

    // Populate headers.
    const CBlockIndex* block_index = stop_index;
    for (int i = headers.size() - 1; i >= 0; i--) {
        int height = (i + 1) * CFCHECKPT_INTERVAL;
        block_index = block_index->GetAncestor(height);

        if (!filter_index->LookupFilterHeader(block_index, headers[i])) {
            LogDebug(BCLog::NET, "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n",
                         BlockFilterTypeName(filter_type), block_index->GetBlockHash().ToString());
            return;
        }
    }

    MakeAndPushMessage(node, NetMsgType::CFCHECKPT,
              filter_type_ser,
              stop_index->GetBlockHash(),
              headers);
}